

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  FILE *__stream_00;
  strbuf *out;
  size_t i;
  ulong uVar5;
  size_t sVar6;
  FILE *__stream_01;
  char *pcVar7;
  long lVar8;
  char *__filename;
  bool bVar9;
  size_t sStack_60;
  BinarySource src [1];
  
  pcVar7 = (char *)0x0;
  __filename = (char *)0x0;
  do {
    bVar1 = 1;
    while( true ) {
      argv = argv + 2;
      argc = argc + -2;
      while( true ) {
        if (argc + 2 < 2) {
          __stream = _stdin;
          if ((__filename == (char *)0x0) ||
             (__stream = fopen(__filename,"r"), __stream_01 = _stderr, __stream != (FILE *)0x0)) {
            __stream_00 = _stdout;
            if ((pcVar7 == (char *)0x0) ||
               (__stream_00 = fopen(pcVar7,"w"), __stream_01 = _stderr, __stream_00 != (FILE *)0x0))
            {
              values = newtree234(valuecmp);
              atexit(free_all_values);
              while( true ) {
                pcVar7 = fgetline((FILE *)__stream);
                pcVar7 = chomp(pcVar7);
                if (pcVar7 == (char *)0x0) break;
                src[0].len = strlen(pcVar7);
                src[0].pos = 0;
                src[0].err = BSE_NO_ERROR;
                src[0].data = pcVar7;
                src[0].binarysource_ = src;
                out = strbuf_new();
                process_line(src,out);
                lVar8 = 8;
                for (uVar5 = 0; uVar5 < nfinalisers; uVar5 = uVar5 + 1) {
                  (**(code **)((long)finalisers + lVar8 + -8))(out);
                  lVar8 = lVar8 + 0x10;
                }
                nfinalisers = 0;
                lVar8 = 0;
                for (sVar6 = 0; out->len != sVar6; sVar6 = sVar6 + 1) {
                  lVar8 = lVar8 + (ulong)(out->s[sVar6] == '\n');
                }
                fprintf(__stream_00,"%zu\n%s",lVar8);
                fflush(__stream_00);
                strbuf_free(out);
                safefree(pcVar7);
              }
              if (__stream != _stdin) {
                fclose(__stream);
                __stream = _stdin;
              }
              if (__stream_00 != __stream) {
                fclose(__stream_00);
                return 0;
              }
              return 0;
            }
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
          }
          else {
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            pcVar7 = __filename;
          }
          fprintf(__stream_01,"%s: open: %s\n",pcVar7,pcVar4);
          return 1;
        }
        pcVar4 = argv[-1];
        if (!(bool)(*pcVar4 != '-' | ~bVar1 & 1)) break;
        argv = argv + 1;
        argc = argc + -1;
        bVar9 = __filename != (char *)0x0;
        __filename = pcVar4;
        if (bVar9) {
          pcVar7 = "can only handle one input file name\n";
          sStack_60 = 0x24;
          goto LAB_0010adb5;
        }
      }
      if ((pcVar4[1] == 'o') && (pcVar4[2] == '\0')) break;
      if (pcVar4[1] != '-') goto LAB_0010adc3;
      argv = argv + -1;
      argc = argc + 1;
      bVar1 = 0;
      if (pcVar4[2] != '\0') {
LAB_0010adc3:
        iVar2 = strcmp(pcVar4,"--help");
        if (iVar2 != 0) {
          fprintf(_stderr,"unknown command line option \'%s\'\n",pcVar4);
          return 1;
        }
        puts("usage: testcrypt [INFILE] [-o OUTFILE]");
        puts(" also: testcrypt --help       display this text");
        return 0;
      }
    }
    if (argc == 0) {
      pcVar7 = "\'-o\' expects a filename\n";
      sStack_60 = 0x18;
LAB_0010adb5:
      fwrite(pcVar7,sStack_60,1,_stderr);
      return 1;
    }
    pcVar7 = *argv;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    const char *infile = NULL, *outfile = NULL;
    bool doing_opts = true;

    while (--argc > 0) {
        char *p = *++argv;

        if (p[0] == '-' && doing_opts) {
            if (!strcmp(p, "-o")) {
                if (--argc <= 0) {
                    fprintf(stderr, "'-o' expects a filename\n");
                    return 1;
                }
                outfile = *++argv;
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "--help")) {
                printf("usage: testcrypt [INFILE] [-o OUTFILE]\n");
                printf(" also: testcrypt --help       display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!infile) {
            infile = p;
        } else {
            fprintf(stderr, "can only handle one input file name\n");
            return 1;
        }
    }

    FILE *infp = stdin;
    if (infile) {
        infp = fopen(infile, "r");
        if (!infp) {
            fprintf(stderr, "%s: open: %s\n", infile, strerror(errno));
            return 1;
        }
    }

    FILE *outfp = stdout;
    if (outfile) {
        outfp = fopen(outfile, "w");
        if (!outfp) {
            fprintf(stderr, "%s: open: %s\n", outfile, strerror(errno));
            return 1;
        }
    }

    values = newtree234(valuecmp);

    atexit(free_all_values);

    for (char *line; (line = chomp(fgetline(infp))) != NULL ;) {
        BinarySource src[1];
        BinarySource_BARE_INIT(src, line, strlen(line));
        strbuf *sb = strbuf_new();
        process_line(src, sb);
        run_finalisers(sb);
        size_t lines = 0;
        for (size_t i = 0; i < sb->len; i++)
            if (sb->s[i] == '\n')
                lines++;
        fprintf(outfp, "%"SIZEu"\n%s", lines, sb->s);
        fflush(outfp);
        strbuf_free(sb);
        sfree(line);
    }

    if (infp != stdin)
        fclose(infp);
    if (outfp != stdin)
        fclose(outfp);

    return 0;
}